

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator * __thiscall
fmt::v5::
vformat_to<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
          (iterator *__return_storage_ptr__,v5 *this,range out,basic_string_view<wchar_t> format_str
          ,basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
           args,locale_ref loc)

{
  basic_string_view<wchar_t> format_str_00;
  undefined1 auStack_a8 [8];
  v5 *local_a0;
  wchar_t *local_98;
  undefined4 local_90;
  wchar_t *local_88;
  size_t sStack_80;
  size_t local_78;
  value_type_conflict vStack_70;
  undefined4 uStack_6c;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  *local_68;
  unsigned_long_long local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_2
  local_58;
  arg_map<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  local_50;
  undefined4 local_38;
  undefined4 local_28;
  
  local_58 = args.field_1;
  local_60 = args.types_;
  local_68 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
              *)format_str.size_;
  local_98 = format_str.data_;
  local_78 = out.it_.super_truncating_iterator_base<wchar_t_*>.count_;
  vStack_70 = out.it_.blackhole_;
  uStack_6c = out.it_._28_4_;
  local_88 = out.it_.super_truncating_iterator_base<wchar_t_*>.out_;
  sStack_80 = out.it_.super_truncating_iterator_base<wchar_t_*>.limit_;
  local_90 = 0;
  local_50.map_ = (entry *)0x0;
  local_50.size_ = 0;
  local_38 = 0;
  local_28 = 0;
  format_str_00.size_ = (size_t)auStack_a8;
  format_str_00.data_ = local_98;
  local_a0 = this;
  internal::
  parse_format_string<false,wchar_t,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>&>
            ((internal *)this,format_str_00,local_68);
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).count_ = local_78;
  __return_storage_ptr__->blackhole_ = vStack_70;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uStack_6c;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).out_ = local_88;
  (__return_storage_ptr__->super_truncating_iterator_base<wchar_t_*>).limit_ = sStack_80;
  internal::
  arg_map<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  ::~arg_map(&local_50);
  return __return_storage_ptr__;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::range out,
    basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    internal::locale_ref loc = internal::locale_ref()) {
  format_handler<ArgFormatter, Char, Context> h(out, format_str, args, loc);
  internal::parse_format_string<false>(format_str, h);
  return h.context.out();
}